

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void cmDependsFortranParser_RuleIfndef(cmDependsFortranParser *parser,char *macro)

{
  iterator iVar1;
  _Elt_pointer pbVar2;
  allocator local_41;
  key_type local_40;
  
  local_40._M_dataplus._M_p._0_1_ = 0;
  pbVar2 = (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar2 == (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<bool,_std::allocator<bool>_>::_M_push_back_aux<bool>
              (&(parser->SkipToEnd).c,(bool *)&local_40);
  }
  else {
    *pbVar2 = false;
    (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = pbVar2 + 1;
  }
  if (parser->InPPFalseBranch == 0) {
    std::__cxx11::string::string((string *)&local_40,macro,&local_41);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(parser->PPDefinitions)._M_t,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_),
                      local_40.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar1._M_node ==
        &(parser->PPDefinitions)._M_t._M_impl.super__Rb_tree_header) {
      pbVar2 = (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (pbVar2 == (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        pbVar2 = (parser->SkipToEnd).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
      }
      pbVar2[-1] = true;
    }
    else {
      parser->InPPFalseBranch = 1;
    }
  }
  else {
    parser->InPPFalseBranch = parser->InPPFalseBranch + 1;
  }
  return;
}

Assistant:

void cmDependsFortranParser_RuleIfndef(cmDependsFortranParser* parser,
  const char* macro)
{
  // A new PP branch has been opened
  parser->SkipToEnd.push(false);

  if (parser->InPPFalseBranch)
    {
    parser->InPPFalseBranch++;
    }
  else if(parser->PPDefinitions.find(macro) != parser->PPDefinitions.end())
    {
    parser->InPPFalseBranch = 1;
    }
  else
    {
    // ignore other branches
    parser->SkipToEnd.top() = true;
    }
}